

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

string * __thiscall
helics::CommonCore::getFederateTag_abi_cxx11_(CommonCore *this,LocalFederateId fid,string_view tag)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long lVar1;
  FederateState *this_01;
  string *psVar2;
  InvalidIdentifier *this_02;
  char *pcVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  long *in_FS_OFFSET;
  string_view message;
  string_view fmt;
  string_view str;
  format_args args;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char *local_38;
  size_t local_30;
  
  this_01 = getFederateAt(this,fid);
  if (fid.fid == -0x103) {
    lVar1 = *in_FS_OFFSET;
    if (*(char *)(lVar1 + -0x13f8) == '\0') {
      *(long *)(lVar1 + -0x1418) = lVar1 + -0x1408;
      *(undefined8 *)(lVar1 + -0x1410) = 0;
      *(undefined1 *)(lVar1 + -0x1408) = 0;
      __cxa_thread_atexit(std::__cxx11::string::~string,lVar1 + -0x1418,&__dso_handle);
      *(undefined1 *)(lVar1 + -0x13f8) = 1;
    }
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x6;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_38;
    local_38 = tag._M_str;
    local_30 = tag._M_len;
    ::fmt::v11::vformat_abi_cxx11_(&local_78,(v11 *)"tag/{}",fmt,args);
    pcVar3 = "core";
    (*(this->super_Core)._vptr_Core[0x5e])
              (&local_58,this,4,"core",local_78._M_string_length,local_78._M_dataplus._M_p,1);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar1 + -0x1418)
    ;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    str._M_str = pcVar3;
    str._M_len = (size_t)(this_00->_M_dataplus)._M_p;
    gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
              ((string *)&local_58,*(stringOps **)(lVar1 + -0x1410),str);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    return (string *)this_00;
  }
  if (this_01 != (FederateState *)0x0) {
    psVar2 = FederateState::getTag_abi_cxx11_(this_01,tag);
    return psVar2;
  }
  this_02 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
  message._M_str = "federateID not valid (getFederateTag)";
  message._M_len = 0x25;
  InvalidIdentifier::InvalidIdentifier(this_02,message);
  __cxa_throw(this_02,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

const std::string& CommonCore::getFederateTag(LocalFederateId fid, std::string_view tag) const
{
    auto* fed = getFederateAt(fid);
    if (fid == gLocalCoreId) {
        static thread_local std::string val;
        val = const_cast<CommonCore*>(this)->query(
            "core",
            fmt::format("tag/{}", tag),
            HelicsSequencingModes::HELICS_SEQUENCING_MODE_ORDERED);
        val = gmlc::utilities::stringOps::removeQuotes(val);
        return val;
    }
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (getFederateTag)"));
    }

    return fed->getTag(tag);
}